

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall r_comp::Decompiler::~Decompiler(Decompiler *this)

{
  OutStream *pOVar1;
  pointer pfVar2;
  void *pvVar3;
  pointer ppSVar4;
  pointer poVar5;
  
  pOVar1 = this->out_stream;
  if (pOVar1 != (OutStream *)0x0) {
    pfVar2 = (pOVar1->positions).m_vector.
             super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
    }
    pvVar3 = (pOVar1->code_indexes_to_stream_indexes).m_vector.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    operator_delete(pOVar1);
  }
  ppSVar4 = (this->imported_objects).
            super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4);
  }
  std::
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->named_objects)._M_h);
  poVar5 = (this->renderers).m_vector.
           super__Vector_base<void_(r_comp::Decompiler::*)(unsigned_short),_std::allocator<void_(r_comp::Decompiler::*)(unsigned_short)>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (poVar5 != (pointer)0x0) {
    operator_delete(poVar5);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->object_indices)._M_h);
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->object_names)._M_h);
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->variable_names)._M_h);
  return;
}

Assistant:

Decompiler::~Decompiler()
{
    if (out_stream) {
        delete out_stream;
    }
}